

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wycheproof_util.cc
# Opt level: O3

UniquePtr<BIGNUM> GetWycheproofBIGNUM(FileTest *t,char *key,bool instruction)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  int in_ECX;
  undefined7 in_register_00000011;
  UniquePtr<BIGNUM> ret;
  UniquePtr<BIGNUM> tmp;
  BIGNUM *bn;
  string value;
  _Head_base<0UL,_bignum_st_*,_false> local_70;
  _Head_base<0UL,_bignum_st_*,_false> local_68;
  undefined1 local_60 [32];
  string local_40;
  
  paVar1 = &local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  if (in_ECX == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_60,(char *)CONCAT71(in_register_00000011,instruction),
               (allocator<char> *)&local_70);
    bVar2 = FileTest::GetAttribute((FileTest *)key,&local_40,(string *)local_60);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_60,(char *)CONCAT71(in_register_00000011,instruction),
               (allocator<char> *)&local_70);
    bVar2 = FileTest::GetInstruction((FileTest *)key,&local_40,(string *)local_60);
  }
  if ((BIGNUM *)local_60._0_8_ != (BIGNUM *)(local_60 + 0x10)) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  if (bVar2 != false) {
    local_60._0_8_ = (BIGNUM *)0x0;
    if ((local_40._M_string_length < 0x80000000) &&
       (iVar3 = BN_hex2bn((BIGNUM **)local_60,local_40._M_dataplus._M_p),
       iVar3 == (int)local_40._M_string_length)) {
      local_70._M_head_impl = (bignum_st *)local_60._0_8_;
      if ((local_40._M_string_length == 0) || (0xf7 < (byte)(*local_40._M_dataplus._M_p - 0x38U))) {
LAB_0040cb86:
        (t->reader_)._M_t.
        super___uniq_ptr_impl<FileTest::LineReader,_std::default_delete<FileTest::LineReader>_>._M_t
        .super__Tuple_impl<0UL,_FileTest::LineReader_*,_std::default_delete<FileTest::LineReader>_>.
        super__Head_base<0UL,_FileTest::LineReader_*,_false>._M_head_impl =
             (LineReader *)local_70._M_head_impl;
        local_70._M_head_impl = (bignum_st *)0x0;
      }
      else {
        local_68._M_head_impl = (bignum_st *)BN_new();
        if (((((BIGNUM *)local_68._M_head_impl != (BIGNUM *)0x0) &&
             (local_40._M_string_length < 0x20000000)) &&
            (iVar3 = BN_set_bit((BIGNUM *)local_68._M_head_impl,(int)local_40._M_string_length << 2)
            , iVar3 != 0)) &&
           (iVar3 = BN_sub((BIGNUM *)local_70._M_head_impl,(BIGNUM *)local_70._M_head_impl,
                           (BIGNUM *)local_68._M_head_impl), iVar3 != 0)) {
          std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_68);
          goto LAB_0040cb86;
        }
        (t->reader_)._M_t.
        super___uniq_ptr_impl<FileTest::LineReader,_std::default_delete<FileTest::LineReader>_>._M_t
        .super__Tuple_impl<0UL,_FileTest::LineReader_*,_std::default_delete<FileTest::LineReader>_>.
        super__Head_base<0UL,_FileTest::LineReader_*,_false>._M_head_impl = (LineReader *)0x0;
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_68);
      }
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_70);
      goto LAB_0040cbb6;
    }
    BN_free((BIGNUM *)local_60._0_8_);
    FileTest::PrintLine((FileTest *)key,"Could not decode value \'%s\'",local_40._M_dataplus._M_p);
  }
  (t->reader_)._M_t.
  super___uniq_ptr_impl<FileTest::LineReader,_std::default_delete<FileTest::LineReader>_>._M_t.
  super__Tuple_impl<0UL,_FileTest::LineReader_*,_std::default_delete<FileTest::LineReader>_>.
  super__Head_base<0UL,_FileTest::LineReader_*,_false>._M_head_impl = (LineReader *)0x0;
LAB_0040cbb6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)t;
}

Assistant:

bssl::UniquePtr<BIGNUM> GetWycheproofBIGNUM(FileTest *t, const char *key,
                                            bool instruction) {
  std::string value;
  bool ok = instruction ? t->GetInstruction(&value, key)
                        : t->GetAttribute(&value, key);
  if (!ok) {
    return nullptr;
  }
  BIGNUM *bn = nullptr;
  if (value.size() > INT_MAX ||
      BN_hex2bn(&bn, value.c_str()) != static_cast<int>(value.size())) {
    BN_free(bn);
    t->PrintLine("Could not decode value '%s'", value.c_str());
    return nullptr;
  }
  bssl::UniquePtr<BIGNUM> ret(bn);
  if (!value.empty()) {
    // If the high bit is one, this is a negative number in Wycheproof.
    // Wycheproof's tests generally mimic Java APIs, including all their
    // mistakes. See
    // https://github.com/google/wycheproof/blob/0329f5b751ef102bd6b7b7181b6e049522a887f5/java/com/google/security/wycheproof/JsonUtil.java#L62.
    if ('0' > value[0] || value[0] > '7') {
      bssl::UniquePtr<BIGNUM> tmp(BN_new());
      if (!tmp ||  //
          value.size() > INT_MAX / 4 ||
          !BN_set_bit(tmp.get(), static_cast<int>(value.size() * 4)) ||
          !BN_sub(ret.get(), ret.get(), tmp.get())) {
        return nullptr;
      }
    }
  }
  return ret;
}